

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::(anonymous_namespace)::Bar_&> __thiscall
kj::dynamicDowncastIfAvailable<kj::(anonymous_namespace)::Bar,kj::(anonymous_namespace)::Foo>
          (kj *this,Foo *from)

{
  Bar *local_38;
  Foo *from_local;
  
  if (from == (Foo *)0x0) {
    local_38 = (Bar *)0x0;
  }
  else {
    local_38 = (Bar *)__dynamic_cast(from,&(anonymous_namespace)::Foo::typeinfo,
                                     &(anonymous_namespace)::Bar::typeinfo,0);
  }
  Maybe<kj::(anonymous_namespace)::Bar_&>::Maybe
            ((Maybe<kj::(anonymous_namespace)::Bar_&> *)this,local_38);
  return (Maybe<kj::(anonymous_namespace)::Bar_&>)(Bar *)this;
}

Assistant:

Maybe<To&> dynamicDowncastIfAvailable(From& from) {
  // If RTTI is disabled, always returns kj::none.  Otherwise, works like dynamic_cast.  Useful
  // in situations where dynamic_cast could allow an optimization, but isn't strictly necessary
  // for correctness.  It is highly recommended that you try to arrange all your dynamic_casts
  // this way, as a dynamic_cast that is necessary for correctness implies a flaw in the interface
  // design.

  // Force a compile error if To is not a subtype of From.  Cross-casting is rare; if it is needed
  // we should have a separate cast function like dynamicCrosscastIfAvailable().
  if (false) {
    kj::implicitCast<From*>(kj::implicitCast<To*>(nullptr));
  }

#if KJ_NO_RTTI
  return kj::none;
#else
  return dynamic_cast<To*>(&from);
#endif
}